

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

HighsLp * withoutSemiVariables
                    (HighsLp *lp_,HighsSolution *solution,double primal_feasibility_tolerance)

{
  value_type vVar1;
  double dVar2;
  value_type vVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  size_type sVar9;
  ostream *poVar10;
  reference __b;
  double *pdVar11;
  vector<double,_std::allocator<double>_> *this;
  byte *in_RDX;
  HighsLp *in_RDI;
  double in_XMM0_Qa;
  double dVar12;
  double binary_value;
  HighsInt new_col;
  HighsInt iEl_2;
  double dl_primal;
  double prev_primal;
  HighsInt iCol_4;
  HighsInt iCol_3;
  bool has_solution;
  bool has_row_names;
  bool has_col_names;
  stringstream ss;
  HighsInt semi_row_num;
  HighsInt semi_col_num;
  HighsInt iEl_1;
  HighsInt iCol_2;
  HighsInt row_num;
  HighsInt iEl;
  HighsInt from_el;
  HighsInt iCol_1;
  HighsInt new_el;
  HighsInt new_num_nz;
  HighsInt num_nz;
  vector<double,_std::allocator<double>_> *value;
  vector<int,_std::allocator<int>_> *index;
  vector<int,_std::allocator<int>_> *start;
  HighsInt iCol;
  HighsInt num_semi_variables;
  HighsInt num_row;
  HighsInt num_col;
  HighsLp *lp;
  value_type *in_stack_fffffffffffffb98;
  HighsLp *in_stack_fffffffffffffba0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffba8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbb0;
  size_type in_stack_fffffffffffffbb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffbc0;
  HighsLp *in_stack_fffffffffffffc18;
  HighsLp *in_stack_fffffffffffffc20;
  string local_360 [32];
  string local_340 [32];
  undefined8 local_320;
  undefined8 local_318;
  value_type local_310;
  int local_308;
  int local_304;
  double local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  value_type local_2e8;
  value_type local_2e0;
  int local_2d4;
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  int local_22c;
  undefined8 local_228;
  int local_220;
  byte local_21b;
  byte local_21a;
  byte local_219;
  stringstream local_218 [16];
  ostream local_208;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_5c;
  int local_58;
  int local_54;
  vector<double,_std::allocator<double>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  HighsLp *local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  byte local_21;
  double local_20;
  byte *local_18;
  
  local_21 = 0;
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  HighsLp::HighsLp(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  local_28 = in_RDI->num_col_;
  local_2c = in_RDI->num_row_;
  local_30 = 0;
  for (local_34 = 0; local_34 < local_28; local_34 = local_34 + 1) {
    pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                       (&in_RDI->integrality_,(long)local_34);
    if ((*pvVar6 == kSemiContinuous) ||
       (pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                           (&in_RDI->integrality_,(long)local_34), *pvVar6 == kSemiInteger)) {
      local_30 = local_30 + 1;
    }
  }
  local_40 = (HighsLp *)&(in_RDI->a_matrix_).start_;
  local_48 = &(in_RDI->a_matrix_).index_;
  local_50 = &(in_RDI->a_matrix_).value_;
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,(long)local_28);
  local_54 = *pvVar7;
  local_5c = local_54 + local_30 * 2;
  local_58 = local_5c;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc0,
             in_stack_fffffffffffffbb8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  iVar4 = local_28;
  while (local_70 = iVar4 + -1, -1 < local_70) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_40,(long)iVar4);
    iVar4 = local_5c;
    local_74 = *pvVar7 + -1;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_40,(long)(local_70 + 1));
    *pvVar7 = iVar4;
    pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                       (&in_RDI->integrality_,(long)local_70);
    if ((*pvVar6 == kSemiContinuous) ||
       (pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                           (&in_RDI->integrality_,(long)local_70), *pvVar6 == kSemiInteger)) {
      local_5c = local_5c + -2;
    }
    for (local_78 = local_74; iVar5 = local_78,
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_40,(long)local_70),
        iVar4 = local_70, *pvVar7 <= iVar5; local_78 = local_78 + -1) {
      local_5c = local_5c + -1;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_78);
      vVar3 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_5c);
      *pvVar7 = vVar3;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_50,(long)local_78);
      vVar1 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_50,(long)local_5c);
      *pvVar8 = vVar1;
    }
  }
  local_7c = local_2c;
  for (local_80 = 0; local_80 < local_28; local_80 = local_80 + 1) {
    pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                       (&in_RDI->integrality_,(long)local_80);
    if ((*pvVar6 == kSemiContinuous) ||
       (pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                           (&in_RDI->integrality_,(long)local_80), *pvVar6 == kSemiInteger)) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_40,(long)(local_80 + 1));
      iVar4 = local_7c;
      local_84 = *pvVar7 + -2;
      local_7c = local_7c + 1;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_84);
      *pvVar7 = iVar4;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_50,(long)local_84);
      iVar4 = local_7c;
      *pvVar8 = 1.0;
      local_84 = local_84 + 1;
      local_7c = local_7c + 1;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_84);
      *pvVar7 = iVar4;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_50,(long)local_84);
      *pvVar8 = 1.0;
    }
  }
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,(long)local_28);
  local_54 = *pvVar7;
  local_58 = local_54 + local_30 * 2;
  local_7c = local_2c;
  local_88 = 0;
  local_8c = 0;
  std::__cxx11::stringstream::stringstream(local_218);
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&in_RDI->col_names_);
  local_219 = sVar9 != 0;
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&in_RDI->row_names_);
  local_21a = sVar9 != 0;
  local_21b = *local_18 & 1;
  if (local_21b != 0) {
    for (local_220 = 0; SBORROW4(local_220,local_30 * 2) != local_220 + local_30 * -2 < 0;
        local_220 = local_220 + 1) {
      local_228 = 0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                 (value_type_conflict1 *)in_stack_fffffffffffffb98);
    }
  }
  for (local_22c = 0; local_22c < local_28; local_22c = local_22c + 1) {
    pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                       (&in_RDI->integrality_,(long)local_22c);
    if ((*pvVar6 == kSemiContinuous) ||
       (pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                           (&in_RDI->integrality_,(long)local_22c), *pvVar6 == kSemiInteger)) {
      local_238 = 0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                 (value_type_conflict1 *)in_stack_fffffffffffffb98);
      local_240 = 0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                 (value_type_conflict1 *)in_stack_fffffffffffffb98);
      local_248 = 0x3ff0000000000000;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                 (value_type_conflict1 *)in_stack_fffffffffffffb98);
      local_250 = 0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                 (value_type_conflict1 *)in_stack_fffffffffffffb98);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbb0,
                 (value_type_conflict1 *)in_stack_fffffffffffffba8);
      if ((local_219 & 1) != 0) {
        std::__cxx11::string::string(local_270);
        std::__cxx11::stringstream::str((string *)local_218);
        std::__cxx11::string::~string(local_270);
        poVar10 = std::operator<<(&local_208,"semi_binary_");
        iVar4 = local_88;
        local_88 = local_88 + 1;
        std::ostream::operator<<(poVar10,iVar4);
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        std::__cxx11::string::~string(local_290);
      }
      if ((local_21a & 1) != 0) {
        std::__cxx11::string::string(local_2b0);
        std::__cxx11::stringstream::str((string *)local_218);
        std::__cxx11::string::~string(local_2b0);
        poVar10 = std::operator<<(&local_208,"semi_lb_");
        std::ostream::operator<<(poVar10,local_8c);
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        std::__cxx11::string::~string(local_2d0);
      }
      local_2d4 = local_7c;
      local_7c = local_7c + 1;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffba0,
                 (value_type_conflict2 *)in_stack_fffffffffffffb98);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->col_lower_,(long)local_22c);
      local_2e0 = -*pvVar8;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                 (value_type_conflict1 *)in_stack_fffffffffffffb98);
      if ((local_21b & 1) != 0) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                            (long)local_22c);
        local_2e8 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                            (long)local_22c);
        if (local_20 < *pvVar8) {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->col_lower_,(long)local_22c);
          __b = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(local_18 + 8),(long)local_22c
                          );
          pdVar11 = std::max<double>(pvVar8,__b);
          dVar2 = *pdVar11;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                              (long)local_22c);
          *pvVar8 = dVar2;
          local_2f8 = 0x3ff0000000000000;
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                     (value_type_conflict1 *)in_stack_fffffffffffffb98);
        }
        else {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                              (long)local_22c);
          *pvVar8 = 0.0;
          local_2f0 = 0;
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                     (value_type_conflict1 *)in_stack_fffffffffffffb98);
        }
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                            (long)local_22c);
        local_300 = *pvVar8 - local_2e8;
        if ((local_300 != 0.0) || (NAN(local_300))) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_40,(long)local_22c);
          for (local_304 = *pvVar7; iVar4 = local_304,
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_40,
                                  (long)(local_22c + 1)), dVar2 = local_300, iVar4 < *pvVar7;
              local_304 = local_304 + 1) {
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_50,(long)local_304);
            dVar12 = *pvVar8;
            this = (vector<double,_std::allocator<double>_> *)(local_18 + 0x38);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_304);
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](this,(long)*pvVar7);
            *pvVar8 = dVar2 * dVar12 + *pvVar8;
          }
        }
        sVar9 = std::vector<double,_std::allocator<double>_>::size(&in_RDI->col_cost_);
        local_308 = (int)sVar9 + -1;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                            (long)local_308);
        local_310 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                            (long)local_22c);
        dVar2 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->col_lower_,(long)local_22c);
        dVar12 = -*pvVar8 * local_310;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x38),
                            (long)(local_7c + -1));
        *pvVar8 = dVar12 + dVar2;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                            (long)local_22c);
        dVar2 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->col_upper_,(long)local_22c);
        dVar12 = -*pvVar8 * local_310;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x38),
                            (long)local_7c);
        *pvVar8 = dVar12 + dVar2;
      }
      local_318 = 0xfff0000000000000;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                 (value_type_conflict1 *)in_stack_fffffffffffffb98);
      local_320 = 0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                 (value_type_conflict1 *)in_stack_fffffffffffffb98);
      if ((local_21a & 1) != 0) {
        std::__cxx11::string::string(local_340);
        std::__cxx11::stringstream::str((string *)local_218);
        std::__cxx11::string::~string(local_340);
        poVar10 = std::operator<<(&local_208,"semi_ub_");
        iVar4 = local_8c;
        local_8c = local_8c + 1;
        std::ostream::operator<<(poVar10,iVar4);
        in_stack_fffffffffffffbb0 = &in_RDI->row_names_;
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        std::__cxx11::string::~string(local_360);
      }
      local_7c = local_7c + 1;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffba0,
                 (value_type_conflict2 *)in_stack_fffffffffffffb98);
      in_stack_fffffffffffffba8 = local_50;
      std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->col_upper_,(long)local_22c);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                 (value_type_conflict1 *)in_stack_fffffffffffffb98);
      in_stack_fffffffffffffba0 = local_40;
      std::vector<int,_std::allocator<int>_>::size(local_48);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffba0,
                 (value_type_conflict2 *)in_stack_fffffffffffffb98);
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::push_back
                ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)in_stack_fffffffffffffba0,
                 (value_type *)in_stack_fffffffffffffb98);
      pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         (&in_RDI->integrality_,(long)local_22c);
      if (*pvVar6 == kSemiContinuous) {
        pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                           (&in_RDI->integrality_,(long)local_22c);
        *pvVar6 = kContinuous;
      }
      else {
        pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                           (&in_RDI->integrality_,(long)local_22c);
        if (*pvVar6 == kSemiInteger) {
          pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                             (&in_RDI->integrality_,(long)local_22c);
          *pvVar6 = kInteger;
        }
      }
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->col_lower_,(long)local_22c);
      *pvVar8 = 0.0;
    }
  }
  local_28 = local_28 + local_30;
  in_RDI->num_col_ = in_RDI->num_col_ + local_30;
  in_RDI->num_row_ = in_RDI->num_row_ + local_30 * 2;
  HighsLpMods::clear((HighsLpMods *)in_stack_fffffffffffffba0);
  local_21 = 1;
  std::__cxx11::stringstream::~stringstream(local_218);
  if ((local_21 & 1) == 0) {
    HighsLp::~HighsLp(in_stack_fffffffffffffba0);
  }
  return in_RDI;
}

Assistant:

HighsLp withoutSemiVariables(const HighsLp& lp_, HighsSolution& solution,
                             const double primal_feasibility_tolerance) {
  HighsLp lp = lp_;
  HighsInt num_col = lp.num_col_;
  HighsInt num_row = lp.num_row_;
  HighsInt num_semi_variables = 0;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger)
      num_semi_variables++;
  }
  assert(num_semi_variables);
  // Insert spaces for index/value of new coefficients for
  // semi-variables
  vector<HighsInt>& start = lp.a_matrix_.start_;
  vector<HighsInt>& index = lp.a_matrix_.index_;
  vector<double>& value = lp.a_matrix_.value_;
  HighsInt num_nz = start[num_col];
  HighsInt new_num_nz = num_nz + 2 * num_semi_variables;
  HighsInt new_el = new_num_nz;
  index.resize(new_num_nz);
  value.resize(new_num_nz);
  for (HighsInt iCol = num_col - 1; iCol >= 0; iCol--) {
    HighsInt from_el = start[iCol + 1] - 1;
    start[iCol + 1] = new_el;
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger)
      new_el -= 2;
    for (HighsInt iEl = from_el; iEl >= start[iCol]; iEl--) {
      new_el--;
      index[new_el] = index[iEl];
      value[new_el] = value[iEl];
    }
  }
  assert(new_el == 0);
  // Insert the new coefficients for semi-variables
  HighsInt row_num = num_row;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
      HighsInt iEl = start[iCol + 1] - 2;
      index[iEl] = row_num++;
      value[iEl] = 1;
      iEl++;
      index[iEl] = row_num++;
      value[iEl] = 1;
    }
  }
  num_nz = start[num_col];
  new_num_nz = num_nz + 2 * num_semi_variables;
  row_num = num_row;
  HighsInt semi_col_num = 0;
  HighsInt semi_row_num = 0;
  // Insert the new variables and their coefficients
  std::stringstream ss;
  const bool has_col_names = (lp.col_names_.size() != 0);
  const bool has_row_names = (lp.row_names_.size() != 0);
  const bool has_solution = solution.value_valid;
  if (has_solution) {
    // Create zeroed row values for the new rows
    assert((HighsInt)solution.row_value.size() == lp_.num_row_);
    for (HighsInt iCol = 0; iCol < 2 * num_semi_variables; iCol++)
      solution.row_value.push_back(0);
    assert((HighsInt)solution.col_value.size() == lp_.num_col_);
    assert((HighsInt)solution.row_value.size() ==
           lp_.num_row_ + 2 * num_semi_variables);
  }
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
      // Add a binary variable with zero cost
      lp.col_cost_.push_back(0);
      lp.col_lower_.push_back(0);
      lp.col_upper_.push_back(1);
      // Complete x - l*y >= 0
      lp.row_lower_.push_back(0);
      lp.row_upper_.push_back(kHighsInf);
      if (has_col_names) {
        // Create a column name
        ss.str(std::string());
        ss << "semi_binary_" << semi_col_num++;
        lp.col_names_.push_back(ss.str());
      }
      if (has_row_names) {
        // Create a row name
        ss.str(std::string());
        ss << "semi_lb_" << semi_row_num;
        lp.row_names_.push_back(ss.str());
      }
      index.push_back(row_num++);
      value.push_back(-lp.col_lower_[iCol]);
      // Accommodate any primal solution
      if (has_solution) {
        // Record the previous solution value so any change can be
        // determined
        const double prev_primal = solution.col_value[iCol];
        if (solution.col_value[iCol] <= primal_feasibility_tolerance) {
          // Currently at or below zero, so binary is 0
          solution.col_value[iCol] = 0;
          solution.col_value.push_back(0);
        } else {
          // Otherwise, solution is at least lower bound, and binary
          // is 1
          solution.col_value[iCol] =
              std::max(lp.col_lower_[iCol], solution.col_value[iCol]);
          solution.col_value.push_back(1);
        }
        const double dl_primal = solution.col_value[iCol] - prev_primal;
        if (dl_primal) {
          // Change in primal value, so update row values. NB start
          // has been extended to incorporate the values in this
          // column for the new rows. Their solution values are zero,
          // but will be set later
          for (HighsInt iEl = start[iCol]; iEl < start[iCol + 1]; iEl++)
            solution.row_value[index[iEl]] += dl_primal * value[iEl];
        }
        const HighsInt new_col = lp.col_cost_.size() - 1;
        const double binary_value = solution.col_value[new_col];
        solution.row_value[row_num - 1] =
            solution.col_value[iCol] - lp.col_lower_[iCol] * binary_value;
        solution.row_value[row_num] =
            solution.col_value[iCol] - lp.col_upper_[iCol] * binary_value;
      }
      // Complete x - u*y <= 0
      lp.row_lower_.push_back(-kHighsInf);
      lp.row_upper_.push_back(0);
      if (has_row_names) {
        // Create a row name
        ss.str(std::string());
        ss << "semi_ub_" << semi_row_num++;
        lp.row_names_.push_back(ss.str());
      }
      index.push_back(row_num++);
      value.push_back(-lp.col_upper_[iCol]);
      // Add the next start
      start.push_back(index.size());
      lp.integrality_.push_back(HighsVarType::kInteger);
      if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous) {
        lp.integrality_[iCol] = HighsVarType::kContinuous;
      } else if (lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
        lp.integrality_[iCol] = HighsVarType::kInteger;
      }
      // Change the lower bound on the semi-variable to zero. Cannot
      // do this earlier, as its original value is used in constraint
      // 0 <= x-l*y
      lp.col_lower_[iCol] = 0;
    }
  }
  num_col += num_semi_variables;
  lp.num_col_ += num_semi_variables;
  lp.num_row_ += 2 * num_semi_variables;
  assert((HighsInt)index.size() == new_num_nz);
  // Clear any modifications inherited from lp_
  lp.mods_.clear();
  return lp;
}